

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O3

void __thiscall Assimp::OpenGEX::OpenGEXImporter::resolveReferences(OpenGEXImporter *this)

{
  RefInfo *pRVar1;
  long lVar2;
  aiNode *paVar3;
  mapped_type mVar4;
  pointer pbVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  Logger *pLVar8;
  aiMesh *paVar9;
  runtime_error *this_00;
  ulong uVar10;
  long lVar11;
  key_type *__k;
  string name;
  key_type local_70;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_50;
  pointer local_48;
  _Base_ptr local_40;
  _Base_ptr local_38;
  
  local_48 = (this->m_unresolvedRefStack).
             super__Vector_base<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if (local_48 !=
      (this->m_unresolvedRefStack).
      super__Vector_base<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_50 = &this->m_material2refMap;
    local_40 = &(this->m_material2refMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_38 = &(this->m_mesh2refMap)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      pRVar1 = (local_48->_M_t).
               super___uniq_ptr_impl<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>
               .super__Head_base<0UL,_Assimp::OpenGEX::OpenGEXImporter::RefInfo_*,_false>.
               _M_head_impl;
      if (pRVar1 != (RefInfo *)0x0) {
        if (pRVar1->m_type == MeshRef) {
          pbVar5 = *(pointer *)
                    &(pRVar1->m_Names).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl;
          if (*(pointer *)
               ((long)&(pRVar1->m_Names).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               + 8) != pbVar5) {
            paVar3 = pRVar1->m_node;
            lVar11 = 0;
            uVar10 = 0;
            do {
              __k = (key_type *)((long)&(pbVar5->_M_dataplus)._M_p + lVar11);
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ::find(&(this->m_mesh2refMap)._M_t,__k);
              if (local_38 != iVar6._M_node) {
                pmVar7 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                         ::operator[](&this->m_mesh2refMap,__k);
                paVar3->mMeshes[uVar10] = (uint)*pmVar7;
              }
              uVar10 = uVar10 + 1;
              pbVar5 = *(pointer *)
                        &(pRVar1->m_Names).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl;
              lVar11 = lVar11 + 0x20;
            } while (uVar10 < (ulong)((long)*(pointer *)
                                             ((long)&(pRVar1->m_Names).
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             + 8) - (long)pbVar5 >> 5));
          }
        }
        else {
          if (pRVar1->m_type != MaterialRef) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_70,"Unknown reference info to resolve.","");
            std::runtime_error::runtime_error(this_00,(string *)&local_70);
            *(undefined ***)this_00 = &PTR__runtime_error_008bf448;
            __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
          }
          pbVar5 = *(pointer *)
                    &(pRVar1->m_Names).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl;
          if (*(pointer *)
               ((long)&(pRVar1->m_Names).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               + 8) != pbVar5) {
            lVar11 = 8;
            uVar10 = 0;
            do {
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              lVar2 = *(long *)((long)pbVar5 + lVar11 + -8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_70,lVar2,
                         *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar11) + lVar2);
              iVar6 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ::find(&local_50->_M_t,&local_70);
              if (local_40 != iVar6._M_node) {
                if (this->m_currentMesh == (aiMesh *)0x0) {
                  pLVar8 = DefaultLogger::get();
                  Logger::warn(pLVar8,
                               "Cannot resolve material reference, because no current mesh is there."
                              );
                }
                else {
                  pmVar7 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                           ::operator[](local_50,&local_70);
                  mVar4 = *pmVar7;
                  paVar9 = this->m_currentMesh;
                  if (paVar9->mMaterialIndex != 0) {
                    pLVar8 = DefaultLogger::get();
                    Logger::warn(pLVar8,
                                 "Override of material reference in current mesh by material reference."
                                );
                    paVar9 = this->m_currentMesh;
                  }
                  paVar9->mMaterialIndex = (uint)mVar4;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              uVar10 = uVar10 + 1;
              pbVar5 = *(pointer *)
                        &(pRVar1->m_Names).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl;
              lVar11 = lVar11 + 0x20;
            } while (uVar10 < (ulong)((long)*(pointer *)
                                             ((long)&(pRVar1->m_Names).
                                                                                                          
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             + 8) - (long)pbVar5 >> 5));
          }
        }
      }
      local_48 = local_48 + 1;
    } while (local_48 !=
             (this->m_unresolvedRefStack).
             super__Vector_base<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>,_std::allocator<std::unique_ptr<Assimp::OpenGEX::OpenGEXImporter::RefInfo,_std::default_delete<Assimp::OpenGEX::OpenGEXImporter::RefInfo>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void OpenGEXImporter::handleColorNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        return;
    }

    Property *prop = node->findPropertyByName( "attrib" );
    if( nullptr != prop ) {
        if( nullptr != prop->m_value ) {
            DataArrayList *colList( node->getDataArrayList() );
            if( nullptr == colList ) {
                return;
            }
            aiColor3D col;
            if ( 3 == colList->m_numItems ) {
                aiColor3D col3;
                getColorRGB3( &col3, colList );
                col = col3;
            } else {
                aiColor4D col4;
                getColorRGB4( &col4, colList );
                col.r = col4.r;
                col.g = col4.g;
                col.b = col4.b;
            }
#ifdef ASSIMP_USE_HUNTER
            const ColorType colType( getColorType( &prop->m_key->m_text ) );
#else
            const ColorType colType( getColorType( prop->m_key ) );
#endif
            if( DiffuseColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_DIFFUSE );
            } else if( SpecularColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_SPECULAR );
            } else if( EmissionColor == colType ) {
                m_currentMaterial->AddProperty( &col, 1, AI_MATKEY_COLOR_EMISSIVE );
            } else if ( LightColor == colType ) {
                m_currentLight->mColorDiffuse = col;
            }
        }
    }
}